

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

undefined8 __thiscall
despot::BaseTag::MostLikelyOpponentPosition
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  double dVar1;
  int iVar2;
  size_type sVar3;
  const_reference ppSVar4;
  const_reference pvVar5;
  reference pvVar6;
  undefined8 uVar7;
  int local_50;
  int i_1;
  int opp;
  double maxWeight;
  TagState *tagstate;
  allocator<double> local_2d;
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_20;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  BaseTag *this_local;
  
  local_20 = particles;
  particles_local = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this;
  if (MostLikelyOpponentPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)::
      probs == '\0') {
    iVar2 = __cxa_guard_acquire(&MostLikelyOpponentPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                                 ::probs);
    if (iVar2 != 0) {
      iVar2 = despot::Floor::NumCells();
      std::allocator<double>::allocator(&local_2d);
      std::vector<double,_std::allocator<double>_>::vector
                (&MostLikelyOpponentPosition::probs,(long)iVar2,&local_2d);
      std::allocator<double>::~allocator(&local_2d);
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,
                   &MostLikelyOpponentPosition::probs,&__dso_handle);
      __cxa_guard_release(&MostLikelyOpponentPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                           ::probs);
    }
  }
  tagstate._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(local_20);
    if (sVar3 <= (ulong)(long)tagstate._4_4_) break;
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (local_20,(long)tagstate._4_4_);
    dVar1 = *(double *)(*ppSVar4 + 0x18);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->opp_,(long)*(int *)(*ppSVar4 + 0xc));
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyOpponentPosition::probs,(long)*pvVar5);
    *pvVar6 = dVar1 + *pvVar6;
    tagstate._4_4_ = tagstate._4_4_ + 1;
  }
  _i_1 = 0.0;
  local_50 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&MostLikelyOpponentPosition::probs);
    if (sVar3 <= (ulong)(long)local_50) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyOpponentPosition::probs,(long)local_50);
    if (_i_1 < *pvVar6) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&MostLikelyOpponentPosition::probs,(long)local_50);
      _i_1 = *pvVar6;
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyOpponentPosition::probs,(long)local_50);
    *pvVar6 = 0.0;
    local_50 = local_50 + 1;
  }
  uVar7 = despot::Floor::GetCell((int)this + 0x58);
  return uVar7;
}

Assistant:

Coord BaseTag::MostLikelyOpponentPosition(
	const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(floor_.NumCells());

	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		probs[opp_[tagstate->state_id]] += tagstate->weight;
	}

	double maxWeight = 0;
	int opp = -1;
	for (int i = 0; i < probs.size(); i++) {
		if (probs[i] > maxWeight) {
			maxWeight = probs[i];
			opp = i;
		}
		probs[i] = 0.0;
	}

	return floor_.GetCell(opp);
}